

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::GeneratorTracker::setGenerator
          (GeneratorTracker *this,GeneratorBasePtr *generator)

{
  clara::std::
  __uniq_ptr_impl<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
  ::operator=((__uniq_ptr_impl<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
               *)&this->m_generator,
              (__uniq_ptr_impl<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
               *)generator);
  return;
}

Assistant:

void setGenerator( GeneratorBasePtr&& generator ) override {
                m_generator = std::move( generator );
            }